

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

void __thiscall
pstore::sparse_array<int,unsigned_int>::
sparse_array<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (sparse_array<int,unsigned_int> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          first_index,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          last_index,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_value,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_value)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  sparse_array<int,unsigned_int> *__s;
  
  uVar2 = bitmap<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                    (first_index,last_index);
  *(uint *)this = uVar2;
  if (first_index._M_current != last_index._M_current) {
    if (first_value._M_current != last_value._M_current) {
      iVar1 = *first_value._M_current;
      first_value._M_current = first_value._M_current + 1;
      *(int *)(this + 4) = iVar1;
    }
    first_index._M_current = first_index._M_current + 1;
  }
  __s = this + 8;
  if (first_value._M_current != last_value._M_current &&
      first_index._M_current != last_index._M_current) {
    do {
      piVar3 = first_value._M_current + 1;
      *(int *)__s = *first_value._M_current;
      first_index._M_current = first_index._M_current + 1;
      __s = __s + 4;
      if (first_index._M_current == last_index._M_current) break;
      first_value._M_current = piVar3;
    } while (piVar3 != last_value._M_current);
  }
  if (first_index._M_current == last_index._M_current) {
    return;
  }
  memset(__s,0,((ulong)((long)last_index._M_current + (-8 - (long)first_index._M_current)) >> 3) * 4
               + 4);
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index,
                                                       IteratorV first_value, IteratorV last_value)
            : bitmap_{bitmap (first_index, last_index)} {

        // Deal with the first element. This is the odd-one-out becuase it's in the
        // declaration of the object and will have been default-constructed by the
        // compiler.
        if (first_index != last_index) {
            if (first_value != last_value) {
                elements_[0] = *(first_value++);
            }
            ++first_index;
        }

        auto out = &elements_[1];

        // Now construct any remaining elements into the uninitialized memory past the
        // end of the object using placement new.
        for (; first_index != last_index && first_value != last_value;
             ++first_index, ++first_value, ++out) {
            new (out) ValueType (*first_value);
        }
        // Default-construct any remaining objects for which we don't have a value.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }